

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *brand)

{
  ListElementCount LVar1;
  IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
  local_148;
  IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
  local_138;
  Fault f;
  Reader scope;
  Reader type;
  Reader binding;
  Reader local_90;
  Reader local_60;
  
  capnp::schema::Brand::Reader::getScopes(&local_60,brand);
  local_138.index = 0;
  local_138.container = &local_60;
  do {
    if (local_138.index == local_60.reader.elementCount) {
      return;
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
    ::operator*(&scope,&local_138);
    if ((scope._reader.dataSize < 0x50) || (*(short *)((long)scope._reader.data + 8) == 0)) {
      capnp::schema::Brand::Scope::Reader::getBind(&local_90,&scope);
      LVar1 = local_90.reader.elementCount;
      local_148.container = &local_90;
      for (local_148.index = 0; local_148.index != LVar1; local_148.index = local_148.index + 1) {
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
        ::operator*(&binding,&local_148);
        if ((0xf < binding._reader.dataSize) && (*binding._reader.data == 1)) {
          capnp::schema::Brand::Binding::Reader::getType(&type,&binding);
          validate(this,&type);
          if ((type._reader.dataSize < 0x10) ||
             ((*type._reader.data < 0x10 && ((0x8fffU >> (*type._reader.data & 0x1f) & 1) != 0)))) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,char_const(&)[46],capnp::schema::Type::Reader&>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                       ,0x24a,FAILED,"isPointer",
                       "\"generic type parameter must be a pointer type\", type",
                       (char (*) [46])"generic type parameter must be a pointer type",&type);
            this->isValid = false;
            kj::_::Debug::Fault::~Fault(&f);
            return;
          }
        }
      }
    }
    local_138.index = local_138.index + 1;
  } while( true );
}

Assistant:

void validate(const schema::Brand::Reader& brand) {
    for (auto scope: brand.getScopes()) {
      switch (scope.which()) {
        case schema::Brand::Scope::BIND:
          for (auto binding: scope.getBind()) {
            switch (binding.which()) {
              case schema::Brand::Binding::UNBOUND:
                break;
              case schema::Brand::Binding::TYPE: {
                auto type = binding.getType();
                validate(type);
                bool isPointer = true;
                switch (type.which()) {
                  case schema::Type::VOID:
                  case schema::Type::BOOL:
                  case schema::Type::INT8:
                  case schema::Type::INT16:
                  case schema::Type::INT32:
                  case schema::Type::INT64:
                  case schema::Type::UINT8:
                  case schema::Type::UINT16:
                  case schema::Type::UINT32:
                  case schema::Type::UINT64:
                  case schema::Type::FLOAT32:
                  case schema::Type::FLOAT64:
                  case schema::Type::ENUM:
                    isPointer = false;
                    break;

                  case schema::Type::TEXT:
                  case schema::Type::DATA:
                  case schema::Type::ANY_POINTER:
                  case schema::Type::STRUCT:
                  case schema::Type::INTERFACE:
                  case schema::Type::LIST:
                    isPointer = true;
                    break;
                }
                VALIDATE_SCHEMA(isPointer,
                    "generic type parameter must be a pointer type", type);

                break;
              }
            }
          }
          break;
        case schema::Brand::Scope::INHERIT:
          break;
      }
    }
  }